

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O2

void __thiscall
Wasm::WasmBytecodeGenerator::EmitBlockCommon
          (WasmBytecodeGenerator *this,BlockInfo *blockInfo,bool *endOnElse)

{
  bool bVar1;
  FunctionBody *this_00;
  bool bVar2;
  WasmOp op;
  int iVar3;
  uint sourceContextId;
  LocalFunctionId functionId;
  BlockInfo *blockInfo_00;
  BlockInfo *pBVar4;
  WasmBinaryReader *pWVar5;
  PolymorphicEmitInfo PVar6;
  uint local_40;
  PolymorphicEmitInfo info;
  
  EnsureStackAvailable(this);
  bVar1 = this->isUnreachable;
  EnterEvalStackScope(this,blockInfo);
  if (endOnElse != (bool *)0x0) {
    *endOnElse = false;
  }
  while( true ) {
    pWVar5 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
    if (pWVar5 == (WasmBinaryReader *)0x0) {
      pWVar5 = (this->m_module->m_reader).ptr;
    }
    iVar3 = (*(pWVar5->super_WasmReaderBase)._vptr_WasmReaderBase[2])();
    op = (WasmOp)iVar3;
    if (op == wbEnd) break;
    if ((endOnElse != (bool *)0x0) && (op == wbElse)) {
      *endOnElse = true;
      pBVar4 = (BlockInfo *)0x5;
LAB_00d6d118:
      this_00 = (this->m_funcInfo->m_body).ptr;
      if (this_00 == (FunctionBody *)0x0) {
        blockInfo_00 = (BlockInfo *)0x23;
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,WasmBytecodePhase);
      }
      else {
        sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this_00);
        functionId = Js::FunctionProxy::GetLocalFunctionId
                               ((FunctionProxy *)(this->m_funcInfo->m_body).ptr);
        blockInfo_00 = (BlockInfo *)0x23;
        bVar2 = Js::Phases::IsEnabled
                          ((Phases *)&DAT_01453738,WasmBytecodePhase,sourceContextId,functionId);
      }
      if (bVar2 != false) {
        PrintOpBegin(this,(WasmOp)pBVar4);
        blockInfo_00 = pBVar4;
      }
      if ((blockInfo->yieldInfo).count != 0) {
        PVar6 = PopStackPolymorphic(this,blockInfo,(char16 *)0x0);
        info._0_8_ = PVar6.field_1;
        blockInfo_00 = (BlockInfo *)&local_40;
        local_40 = PVar6.count;
        PVar6._4_4_ = 0;
        PVar6.count = local_40;
        PVar6.field_1 =
             (anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1)
             (anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1)info._0_8_;
        YieldToBlock(this,blockInfo,PVar6);
        ReleaseLocation(this,(PolymorphicEmitInfo *)blockInfo_00);
      }
      ExitEvalStackScope(this,blockInfo_00);
      if (bVar1 != false) {
        return;
      }
      SetUnreachableState(this,false);
      return;
    }
    EmitExpr(this,op);
  }
  pBVar4 = (BlockInfo *)0xb;
  goto LAB_00d6d118;
}

Assistant:

void WasmBytecodeGenerator::EmitBlockCommon(BlockInfo* blockInfo, bool* endOnElse /*= nullptr*/)
{
    EnsureStackAvailable();
    bool canResetUnreachable = !IsUnreachable();
    WasmOp op;
    EnterEvalStackScope(blockInfo);

    if(endOnElse) *endOnElse = false;
    do {
        op = GetReader()->ReadExpr();
        if (op == wbEnd)
        {
            break;
        }
        if (endOnElse && op == wbElse)
        {
            *endOnElse = true;
            break;
        }
        EmitExpr(op);
    } while (true);
    DebugPrintOp(op);
    if (blockInfo->HasYield())
    {
        PolymorphicEmitInfo info = PopStackPolymorphic(blockInfo);
        YieldToBlock(blockInfo, info);
        ReleaseLocation(&info);
    }
    ExitEvalStackScope(blockInfo);
    if (canResetUnreachable)
    {
        SetUnreachableState(false);
    }
}